

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall cmTarget::ClearDependencyInformation(cmTarget *this,cmMakefile *mf)

{
  pointer pcVar1;
  string depname;
  string local_38;
  
  pcVar1 = (this->Name)._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (this->Name)._M_string_length);
  std::__cxx11::string::append((char *)&local_38);
  cmMakefile::RemoveCacheDefinition(mf,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmTarget::ClearDependencyInformation(cmMakefile& mf)
{
  std::string depname = this->GetName();
  depname += "_LIB_DEPENDS";
  mf.RemoveCacheDefinition(depname);
}